

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall
TestCharReaderAllowZeroesTestissue176::runTestCase(TestCharReaderAllowZeroesTestissue176 *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  TestResult *pTVar2;
  int iVar3;
  ArrayIndex AVar4;
  Value *pVVar5;
  CharReader *pCVar6;
  string errs;
  Value root;
  char doc [20];
  CharReaderBuilder b;
  ValueHolder local_188 [2];
  undefined1 local_178 [24];
  string local_160;
  undefined1 *local_140;
  long local_138;
  undefined1 local_130 [16];
  Value local_120;
  char local_f8 [32];
  CharReaderBuilder local_d8;
  Value local_a8;
  Value local_80;
  Value local_58;
  
  Json::CharReaderBuilder::CharReaderBuilder(&local_d8);
  Json::Value::Value(&local_58,true);
  pVVar5 = Json::Value::operator[](&local_d8.settings_,"allowSingleQuotes");
  Json::Value::operator=(pVVar5,&local_58);
  Json::Value::~Value(&local_58);
  Json::Value::Value(&local_120,nullValue);
  local_138 = 0;
  local_130[0] = 0;
  local_140 = local_130;
  pCVar6 = Json::CharReaderBuilder::newCharReader(&local_d8);
  builtin_strncpy(local_f8,"{\'a\':true,\"b\":true}",0x14);
  iVar3 = (*pCVar6->_vptr_CharReader[2])(pCVar6,local_f8,local_f8 + 0x13,&local_120,&local_140);
  if ((char)iVar3 == '\0') {
    JsonTest::TestResult::addFailure
              ((this->super_CharReaderAllowZeroesTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x8b3,"ok");
  }
  pTVar2 = (this->super_CharReaderAllowZeroesTest).super_TestCase.result_;
  local_188[0].string_ = local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"");
  paVar1 = &local_160.field_2;
  local_160._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_160,local_140,local_140 + local_138);
  JsonTest::checkStringEqual
            (pTVar2,(string *)local_188,&local_160,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x8b4,"\"\" == errs");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != paVar1) {
    operator_delete(local_160._M_dataplus._M_p);
  }
  if (local_188[0] != local_178) {
    operator_delete(local_188[0].string_);
  }
  pTVar2 = (this->super_CharReaderAllowZeroesTest).super_TestCase.result_;
  AVar4 = Json::Value::size(&local_120);
  JsonTest::checkEqual<unsigned_int,unsigned_int>
            (pTVar2,2,AVar4,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x8b5,"2u == root.size()");
  pTVar2 = (this->super_CharReaderAllowZeroesTest).super_TestCase.result_;
  Json::Value::Value((Value *)local_188,false);
  Json::Value::get(&local_80,&local_120,"a",(Value *)local_188);
  JsonTest::checkEqual<bool,Json::Value>
            (pTVar2,true,&local_80,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x8b6,"true == root.get(\"a\", false)");
  Json::Value::~Value(&local_80);
  Json::Value::~Value((Value *)local_188);
  pTVar2 = (this->super_CharReaderAllowZeroesTest).super_TestCase.result_;
  Json::Value::Value((Value *)local_188,false);
  Json::Value::get(&local_a8,&local_120,"b",(Value *)local_188);
  JsonTest::checkEqual<bool,Json::Value>
            (pTVar2,true,&local_a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x8b7,"true == root.get(\"b\", false)");
  Json::Value::~Value(&local_a8);
  Json::Value::~Value((Value *)local_188);
  builtin_strncpy(local_f8,"{\'a\': \'x\', \"b\":\'y\'}",0x14);
  iVar3 = (*pCVar6->_vptr_CharReader[2])(pCVar6,local_f8,local_f8 + 0x13,&local_120,&local_140);
  if ((char)iVar3 == '\0') {
    JsonTest::TestResult::addFailure
              ((this->super_CharReaderAllowZeroesTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x8be,"ok");
  }
  pTVar2 = (this->super_CharReaderAllowZeroesTest).super_TestCase.result_;
  local_188[0].string_ = local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"");
  local_160._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_160,local_140,local_140 + local_138);
  JsonTest::checkStringEqual
            (pTVar2,(string *)local_188,&local_160,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x8bf,"\"\" == errs");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != paVar1) {
    operator_delete(local_160._M_dataplus._M_p);
  }
  if (local_188[0] != local_178) {
    operator_delete(local_188[0].string_);
  }
  pTVar2 = (this->super_CharReaderAllowZeroesTest).super_TestCase.result_;
  AVar4 = Json::Value::size(&local_120);
  JsonTest::checkEqual<unsigned_int,unsigned_int>
            (pTVar2,2,AVar4,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x8c0,"2u == root.size()");
  pTVar2 = (this->super_CharReaderAllowZeroesTest).super_TestCase.result_;
  local_188[0].string_ = local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"x","");
  pVVar5 = Json::Value::operator[](&local_120,"a");
  Json::Value::asString_abi_cxx11_(&local_160,pVVar5);
  JsonTest::checkStringEqual
            (pTVar2,(string *)local_188,&local_160,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x8c1,"\"x\" == root[\"a\"].asString()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != paVar1) {
    operator_delete(local_160._M_dataplus._M_p);
  }
  if (local_188[0] != local_178) {
    operator_delete(local_188[0].string_);
  }
  pTVar2 = (this->super_CharReaderAllowZeroesTest).super_TestCase.result_;
  local_188[0].string_ = local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"y","");
  pVVar5 = Json::Value::operator[](&local_120,"b");
  Json::Value::asString_abi_cxx11_(&local_160,pVVar5);
  JsonTest::checkStringEqual
            (pTVar2,(string *)local_188,&local_160,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x8c2,"\"y\" == root[\"b\"].asString()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != paVar1) {
    operator_delete(local_160._M_dataplus._M_p);
  }
  if (local_188[0] != local_178) {
    operator_delete(local_188[0].string_);
  }
  if (local_140 != local_130) {
    operator_delete(local_140);
  }
  Json::Value::~Value(&local_120);
  Json::CharReaderBuilder::~CharReaderBuilder(&local_d8);
  return;
}

Assistant:

JSONTEST_FIXTURE(CharReaderAllowZeroesTest, issue176) {
  Json::CharReaderBuilder b;
  b.settings_["allowSingleQuotes"] = true;
  Json::Value root;
  std::string errs;
  Json::CharReader* reader(b.newCharReader());
  {
    char const doc[] = "{'a':true,\"b\":true}";
    bool ok = reader->parse(
        doc, doc + std::strlen(doc),
        &root, &errs);
    JSONTEST_ASSERT(ok);
    JSONTEST_ASSERT_STRING_EQUAL("", errs);
    JSONTEST_ASSERT_EQUAL(2u, root.size());
    JSONTEST_ASSERT_EQUAL(true, root.get("a", false));
    JSONTEST_ASSERT_EQUAL(true, root.get("b", false));
  }
  {
    char const doc[] = "{'a': 'x', \"b\":'y'}";
    bool ok = reader->parse(
        doc, doc + std::strlen(doc),
        &root, &errs);
    JSONTEST_ASSERT(ok);
    JSONTEST_ASSERT_STRING_EQUAL("", errs);
    JSONTEST_ASSERT_EQUAL(2u, root.size());
    JSONTEST_ASSERT_STRING_EQUAL("x", root["a"].asString());
    JSONTEST_ASSERT_STRING_EQUAL("y", root["b"].asString());
  }
}